

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O3

CallFrame * __thiscall pstack::Dwarf::FDE::defaultFrame(CallFrame *__return_storage_ptr__,FDE *this)

{
  CIE *pCVar1;
  Off offset;
  Reader *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar2;
  undefined4 extraout_var;
  CallFrame *pCVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  byte local_2b8 [8];
  uchar q;
  undefined1 local_118 [8];
  CallFrame dframe;
  stack<pstack::Dwarf::CallFrame,_std::deque<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>_>
  stack;
  int reg;
  Off OVar3;
  
  CallFrame::CallFrame((CallFrame *)local_118);
  pCVar1 = this->cie;
  offset = pCVar1->initial_instructions;
  OVar3 = pCVar1->end;
  this_00 = (pCVar1->frameInfo->io).
            super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (pCVar1->frameInfo->io).
            super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  if (OVar3 == 0xffffffffffffffff) {
    iVar2 = (*this_00->_vptr_Reader[8])(this_00);
    OVar3 = CONCAT44(extraout_var,iVar2);
  }
  dframe.cfaValue.u.expression.length = 0;
  std::_Deque_base<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>::
  _M_initialize_map((_Deque_base<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>
                     *)((long)&dframe.cfaValue.u + 8),0);
  std::
  _Rb_tree<int,_std::pair<const_int,_pstack::Dwarf::RegisterUnwind>,_std::_Select1st<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>_>
  ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_pstack::Dwarf::RegisterUnwind>,_std::_Select1st<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>_>
              *)__return_storage_ptr__,
             (_Rb_tree<int,_std::pair<const_int,_pstack::Dwarf::RegisterUnwind>,_std::_Select1st<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>_>
              *)local_118);
  (__return_storage_ptr__->cfaValue).u.same = dframe.cfaValue._0_8_;
  (__return_storage_ptr__->cfaValue).u.expression.length = dframe.cfaValue.u.same;
  *(size_t *)&__return_storage_ptr__->cfaReg =
       dframe.registers._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->cfaValue).type = dframe.cfaReg;
  *(undefined4 *)&(__return_storage_ptr__->cfaValue).field_0x4 = dframe._52_4_;
  if (offset == OVar3) {
    std::deque<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>::~deque
              ((deque<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_> *)
               ((long)&dframe.cfaValue.u + 8));
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_pstack::Dwarf::RegisterUnwind>,_std::_Select1st<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_pstack::Dwarf::RegisterUnwind>,_std::_Select1st<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>_>
                 *)local_118);
    return __return_storage_ptr__;
  }
  Reader::readObj<unsigned_char>(this_00,offset,local_2b8,1);
  pCVar4 = (CallFrame *)
           (*(code *)(&DAT_00164564 + *(int *)(&DAT_00164564 + (ulong)(local_2b8[0] >> 6) * 4)))();
  return pCVar4;
}

Assistant:

CallFrame
FDE::defaultFrame() const {
   CallFrame dframe;
   // Execute all of the initial_instructions in the CIE, creating the starting
   // point for a frame. XXX: It might be worth caching this in the CIE, but
   // there's rarely a huge number of instructions here .
   // The initial instructions extend from the given point in the CIE to the
   // end of its extent.
   return cie.execInsns(dframe, cie.initial_instructions, cie.end, 0,
         [](uintmax_t, CallFrame &) { return false; });
}